

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeAddWindow(ImGuiDockNode *node,ImGuiWindow *window,bool add_to_tab_bar)

{
  ImVector<ImGuiWindow_*> *this;
  ImGuiID IVar1;
  ImGuiDockNode *node_00;
  ushort uVar2;
  ImGuiWindow **ppIVar3;
  ushort uVar4;
  int n;
  int i;
  ImGuiTabBar *pIVar5;
  bool bVar6;
  bool bVar7;
  ImGuiWindow *local_28;
  
  node_00 = window->DockNode;
  local_28 = window;
  if (node_00 != (ImGuiDockNode *)0x0) {
    if (node_00->ID == node->ID) {
      __assert_fail("window->DockNode->ID != node->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x311c,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
    DockNodeRemoveWindow(node_00,window,0);
    if ((window->DockNode != (ImGuiDockNode *)0x0) &&
       (window->DockNodeAsHost != (ImGuiDockNode *)0x0)) {
      __assert_fail("window->DockNode == __null || window->DockNodeAsHost == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x311f,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
  }
  this = &node->Windows;
  ImVector<ImGuiWindow_*>::push_back(this,&local_28);
  node->field_0xba = node->field_0xba | 2;
  local_28->DockNode = node;
  local_28->DockId = node->ID;
  local_28->field_0x492 = local_28->field_0x492 & 0xfa | 1 < (node->Windows).Size;
  if (node->HostWindow == (ImGuiWindow *)0x0) {
    if (this->Size == 2) {
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](this,0);
      if ((*ppIVar3)->WasActive == false) {
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[](this,0);
        (*ppIVar3)->Hidden = true;
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[](this,0);
        (*ppIVar3)->HiddenFramesCanSkipItems = 1;
      }
      if (node->HostWindow != (ImGuiWindow *)0x0) goto LAB_001391e0;
    }
    if ((node->ParentNode == (ImGuiDockNode *)0x0) && ((node->LocalFlags & 0x400U) == 0)) {
      uVar2 = *(ushort *)&node->field_0xb8;
      bVar6 = (uVar2 & 7) == 0;
      uVar4 = uVar2 | 2;
      if (!bVar6) {
        uVar4 = uVar2;
      }
      bVar7 = (uVar4 & 0x38) == 0;
      uVar2 = uVar4 | 0x10;
      if (!bVar7) {
        uVar2 = uVar4;
      }
      if (!(bool)(~(bVar7 || bVar6) & (uVar2 & 0x1c0) != 0)) {
        uVar4 = uVar2 | 0x80;
        if ((uVar2 & 0x1c0) != 0) {
          uVar4 = uVar2;
        }
        *(ushort *)&node->field_0xb8 = uVar4;
      }
    }
  }
LAB_001391e0:
  if (add_to_tab_bar) {
    pIVar5 = node->TabBar;
    if (pIVar5 == (ImGuiTabBar *)0x0) {
      DockNodeAddTabBar(node);
      IVar1 = node->SelectedTabId;
      pIVar5 = node->TabBar;
      pIVar5->NextSelectedTabId = IVar1;
      pIVar5->SelectedTabId = IVar1;
      for (i = 0; pIVar5 = node->TabBar, i < (node->Windows).Size + -1; i = i + 1) {
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[](this,i);
        TabBarAddTab(pIVar5,0,*ppIVar3);
      }
    }
    TabBarAddTab(pIVar5,0x400000,local_28);
  }
  DockNodeUpdateVisibleFlag(node);
  if (node->HostWindow != (ImGuiWindow *)0x0) {
    UpdateWindowParentAndRootLinks(local_28,local_28->Flags | 0x1000000,node->HostWindow);
  }
  return;
}

Assistant:

static void ImGui::DockNodeAddWindow(ImGuiDockNode* node, ImGuiWindow* window, bool add_to_tab_bar)
{
    ImGuiContext& g = *GImGui; (void)g;
    if (window->DockNode)
    {
        // Can overwrite an existing window->DockNode (e.g. pointing to a disabled DockSpace node)
        IM_ASSERT(window->DockNode->ID != node->ID);
        DockNodeRemoveWindow(window->DockNode, window, 0);
    }
    IM_ASSERT(window->DockNode == NULL || window->DockNodeAsHost == NULL);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeAddWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    node->Windows.push_back(window);
    node->WantHiddenTabBarUpdate = true;
    window->DockNode = node;
    window->DockId = node->ID;
    window->DockIsActive = (node->Windows.Size > 1);
    window->DockTabWantClose = false;

    // If more than 2 windows appeared on the same frame, we'll create a new hosting DockNode from the point of the second window submission.
    // Then we need to hide the first window (after its been output) otherwise it would be visible as a standalone window for one frame.
    if (node->HostWindow == NULL && node->Windows.Size == 2 && node->Windows[0]->WasActive == false)
    {
        node->Windows[0]->Hidden = true;
        node->Windows[0]->HiddenFramesCanSkipItems = 1;
    }

    // When reactivating a node with one or two loose window, the window pos/size/viewport are authoritative over the node storage.
    // In particular it is important we init the viewport from the first window so we don't create two viewports and drop one.
    if (node->HostWindow == NULL && node->IsFloatingNode())
    {
        if (node->AuthorityForPos == ImGuiDataAuthority_Auto)
            node->AuthorityForPos = ImGuiDataAuthority_Window;
        if (node->AuthorityForSize == ImGuiDataAuthority_Auto)
            node->AuthorityForSize = ImGuiDataAuthority_Window;
        if (node->AuthorityForViewport == ImGuiDataAuthority_Auto)
            node->AuthorityForViewport = ImGuiDataAuthority_Window;
    }

    // Add to tab bar if requested
    if (add_to_tab_bar)
    {
        if (node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            node->TabBar->SelectedTabId = node->TabBar->NextSelectedTabId = node->SelectedTabId;

            // Add existing windows
            for (int n = 0; n < node->Windows.Size - 1; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }
        TabBarAddTab(node->TabBar, ImGuiTabItemFlags_Unsorted, window);
    }

    DockNodeUpdateVisibleFlag(node);

    // Update this without waiting for the next time we Begin() in the window, so our host window will have the proper title bar color on its first frame.
    if (node->HostWindow)
        UpdateWindowParentAndRootLinks(window, window->Flags | ImGuiWindowFlags_ChildWindow, node->HostWindow);
}